

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

pointer __thiscall
google::protobuf::RepeatedField<long>::Mutable(RepeatedField<long> *this,int index)

{
  int iVar1;
  long *plVar2;
  
  if (index < 0) {
    Mutable();
  }
  else {
    iVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar1) {
      plVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return plVar2 + (uint)index;
    }
  }
  Mutable();
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  if constexpr (internal::GetBoundsCheckMode() ==
                internal::BoundsCheckMode::kAbort) {
    internal::RuntimeAssertInBounds(index, size());
  } else {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, size());
  }
  return &elements(is_soo())[index];
}